

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.cpp
# Opt level: O0

bool __thiscall Clasp::Lookahead::propagateFixpoint(Lookahead *this,Solver *s,PostPropagator *ctx)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  long in_RDX;
  undefined8 in_RSI;
  Solver *in_RDI;
  Solver *in_stack_00000018;
  Lookahead *in_stack_00000020;
  uint32 dl;
  bool ok;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_stack_ffffffffffffff98;
  ScoreLook *in_stack_ffffffffffffffa0;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *this_00;
  undefined4 in_stack_ffffffffffffffa8;
  uint32 in_stack_ffffffffffffffac;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_stack_ffffffffffffffc0;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> local_38;
  uint32 local_28;
  byte local_21;
  long local_20;
  undefined8 local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = empty((Lookahead *)0x246172);
  if (!bVar1) {
    in_stack_ffffffffffffffac = *(uint32 *)&in_RDI->ccMin_;
    uVar2 = Solver::numAssignedVars((Solver *)0x24618f);
    if (in_stack_ffffffffffffffac != uVar2) goto LAB_002461b9;
  }
  bVar1 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &(in_RDI->lower).bound);
  if (!bVar1) {
    return true;
  }
LAB_002461b9:
  local_21 = 1;
  local_28 = Solver::decisionLevel((Solver *)0x2461c8);
  do {
    bVar1 = propagateLevel(in_stack_00000020,in_stack_00000018);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_0024622d:
      if ((((local_21 & 1) != 0) && (local_28 == 0)) &&
         ((int)(in_RDI->stats).super_CoreStats.analyzed != 0)) {
        uVar2 = Solver::numAssignedVars((Solver *)0x246250);
        *(uint32 *)&in_RDI->ccMin_ = uVar2;
        this_00 = &local_38;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector
                  (in_stack_ffffffffffffffc0);
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::swap
                  (this_00,in_stack_ffffffffffffff98);
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::~pod_vector
                  ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x24628b);
      }
      if (((local_20 == 0) && (*(int *)((long)&in_RDI->ccMin_ + 4) != 0)) &&
         (iVar3 = *(int *)((long)&in_RDI->ccMin_ + 4) + -1,
         *(int *)((long)&in_RDI->ccMin_ + 4) = iVar3, iVar3 == 0)) {
        (**(code **)(*(long *)in_RDI + 0x28))(in_RDI,local_18,1);
      }
      return (bool)(local_21 & 1);
    }
    bVar1 = Solver::resolveConflict(in_stack_00000018);
    if ((!bVar1) ||
       (bVar1 = Solver::propagateUntil
                          (in_RDI,(PostPropagator *)
                                  CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
       !bVar1)) {
      local_21 = 0;
      ScoreLook::clearDeps(in_stack_ffffffffffffffa0);
      goto LAB_0024622d;
    }
    local_28 = Solver::decisionLevel((Solver *)0x246227);
  } while( true );
}

Assistant:

bool Lookahead::propagateFixpoint(Solver& s, PostPropagator* ctx) {
	if ((empty() || top_ == s.numAssignedVars()) && !score.deps.empty()) {
		// nothing to lookahead
		return true;
	}
	bool ok = true;
	uint32 dl;
	for (dl = s.decisionLevel(); !propagateLevel(s); dl = s.decisionLevel()) {
		// some literal failed
		// resolve and propagate conflict
		assert(s.decisionLevel() >= dl);
		if (!s.resolveConflict() || !s.propagateUntil(this)) {
			ok = false;
			score.clearDeps();
			break;
		}
	}
	if (ok && dl == 0 && score.limit > 0) {
		// remember top-level size - no need to redo lookahead
		// on level 0 unless we learn a new implication
		assert(s.queueSize() == 0);
		top_ = s.numAssignedVars();
		LitVec().swap(imps_);
	}
	if (!ctx && limit_ && --limit_ == 0) {
		this->destroy(&s, true);
	}
	return ok;
}